

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontSym.cpp
# Opt level: O0

void __thiscall
TPZFrontSym<long_double>::ExtractFrontMatrix
          (TPZFrontSym<long_double> *this,TPZFMatrix<long_double> *front)

{
  int64_t iVar1;
  long *plVar2;
  longdouble *plVar3;
  long *in_RSI;
  TPZFMatrix<long_double> *in_RDI;
  int64_t *this_00;
  int64_t jl;
  int64_t il;
  int64_t jeq;
  int64_t ieq;
  int64_t numeq;
  int64_t mineq;
  int64_t maxeq;
  long j;
  int64_t in_stack_ffffffffffffff98;
  undefined2 in_stack_ffffffffffffffa0;
  undefined2 in_stack_ffffffffffffffa2;
  undefined4 in_stack_ffffffffffffffa4;
  undefined6 in_stack_ffffffffffffffa8;
  undefined2 in_stack_ffffffffffffffae;
  int64_t local_38;
  int64_t local_30;
  int64_t local_20;
  
  iVar1 = TPZVec<long>::NElements((TPZVec<long> *)&(in_RDI->fWork).fNElements);
  local_20 = 0;
  while ((local_20 < iVar1 &&
         (plVar2 = TPZVec<long>::operator[]((TPZVec<long> *)&(in_RDI->fWork).fNElements,local_20),
         *plVar2 == -1))) {
    local_20 = local_20 + 1;
  }
  (**(code **)(*in_RSI + 0x70))(in_RSI,iVar1 - local_20,iVar1 - local_20);
  for (local_30 = local_20; local_30 < iVar1; local_30 = local_30 + 1) {
    plVar2 = TPZVec<long>::operator[]((TPZVec<long> *)&(in_RDI->fWork).fNElements,local_30);
    if (*plVar2 != -1) {
      for (local_38 = local_30; local_38 < iVar1; local_38 = local_38 + 1) {
        plVar2 = TPZVec<long>::operator[]((TPZVec<long> *)&(in_RDI->fWork).fNElements,local_38);
        if (*plVar2 != -1) {
          this_00 = &(in_RDI->fWork).fNElements;
          plVar2 = TPZVec<long>::operator[]((TPZVec<long> *)this_00,local_30);
          j = *plVar2;
          TPZVec<long>::operator[]((TPZVec<long> *)this_00,local_38);
          plVar3 = Element((TPZFrontSym<long_double> *)
                           CONCAT44(in_stack_ffffffffffffffa4,
                                    CONCAT22(in_stack_ffffffffffffffa2,in_stack_ffffffffffffffa0)),
                           in_stack_ffffffffffffff98,j);
          in_stack_ffffffffffffff98 = SUB108(*plVar3,0);
          in_stack_ffffffffffffffa0 = (undefined2)((unkuint10)*plVar3 >> 0x40);
          plVar3 = TPZFMatrix<long_double>::operator()
                             (in_RDI,CONCAT26(in_stack_ffffffffffffffae,in_stack_ffffffffffffffa8),
                              CONCAT44(in_stack_ffffffffffffffa4,
                                       CONCAT22(in_stack_ffffffffffffffa2,in_stack_ffffffffffffffa0)
                                      ));
          *plVar3 = (longdouble)CONCAT28(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
          plVar3 = TPZFMatrix<long_double>::operator()
                             (in_RDI,CONCAT26(in_stack_ffffffffffffffae,in_stack_ffffffffffffffa8),
                              CONCAT44(in_stack_ffffffffffffffa4,
                                       CONCAT22(in_stack_ffffffffffffffa2,in_stack_ffffffffffffffa0)
                                      ));
          in_stack_ffffffffffffffa4 = SUB104(*plVar3,0);
          in_stack_ffffffffffffffa8 = (undefined6)((unkuint10)*plVar3 >> 0x20);
          plVar3 = TPZFMatrix<long_double>::operator()
                             (in_RDI,CONCAT26(in_stack_ffffffffffffffae,in_stack_ffffffffffffffa8),
                              CONCAT44(in_stack_ffffffffffffffa4,
                                       CONCAT22(in_stack_ffffffffffffffa2,in_stack_ffffffffffffffa0)
                                      ));
          *plVar3 = (longdouble)CONCAT64(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4);
        }
      }
    }
  }
  return;
}

Assistant:

void TPZFrontSym<TVar>::ExtractFrontMatrix(TPZFMatrix<TVar> &front)
{
	int64_t maxeq = this->fLocal.NElements();
	int64_t mineq = 0;
	for(mineq=0; mineq<maxeq; mineq++) if(this->fLocal[mineq] != -1) break;
	int64_t numeq = maxeq-mineq;
	front.Redim(numeq,numeq);
	int64_t ieq,jeq;
	for(ieq=mineq;ieq<maxeq;ieq++) {
		if(this->fLocal[ieq] == -1) continue;
		int64_t il = ieq-mineq;
		for(jeq=ieq;jeq<maxeq;jeq++) {
			if(this->fLocal[jeq] == -1) continue;
			int64_t jl = jeq-mineq;
			front(il,jl) = this->Element(this->fLocal[ieq],this->fLocal[jeq]);
			front(jl,il) = front(il,jl);
		}
	}
	
}